

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_in_parser.h
# Opt level: O2

bool parse::parse_column<float>(string *str,vector<float,_std::allocator<float>_> *vec)

{
  long lVar1;
  pointer str_00;
  size_type sVar2;
  bool bVar3;
  int num;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elements;
  float tmp;
  string arr_str;
  string num_str;
  
  bVar3 = false;
  lVar1 = std::__cxx11::string::find((char *)str,0x124250);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&num_str,(ulong)str);
    std::__cxx11::string::substr((ulong)&arr_str,(ulong)str);
    parse_column(&num_str,&num);
    elements.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elements.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    elements.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar2 = 0;
    while( true ) {
      lVar1 = std::__cxx11::string::find((char)&arr_str,0x2c);
      if (lVar1 == -1) break;
      std::__cxx11::string::substr((ulong)&tmp,(ulong)&arr_str);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&elements,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      sVar2 = lVar1 + 1;
    }
    if (sVar2 != arr_str._M_string_length) {
      std::__cxx11::string::substr((ulong)&tmp,(ulong)&arr_str);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&elements,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
    }
    for (str_00 = elements.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        str_00 != elements.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; str_00 = str_00 + 1) {
      parse_column(str_00,&tmp);
      std::vector<float,_std::allocator<float>_>::push_back(vec,&tmp);
    }
    bVar3 = (long)(vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2 == (long)num;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&elements);
    std::__cxx11::string::~string((string *)&arr_str);
    std::__cxx11::string::~string((string *)&num_str);
  }
  return bVar3;
}

Assistant:

bool parse_column(const std::string& str, std::vector<T> *vec){
    bool ret = true;
    std::string::size_type pos = str.find(":");
    if (pos == std::string::npos){
        ret = false;
        return ret;
    }
    std::string num_str = str.substr(0, pos-0);
    std::string arr_str = str.substr(pos+1, str.length()-pos-1);
    int num;
    if (parse_column(num_str, &num) == -1){
        ret = false;
        return ret;
    };
    std::vector<std::string> elements;
    std::string::size_type start = 0;
    std::string::size_type end = arr_str.find(',');
    while (std::string::npos != end){
        elements.push_back(arr_str.substr(start, end - start));
        start = end + 1;
        end = arr_str.find(',', start);
    }
    if (start != arr_str.length()){
        elements.push_back(arr_str.substr(start));
    }
    for (std::vector<std::string>::const_iterator iter = elements.begin();
        iter != elements.end(); iter++){
        T tmp;
        parse_column(*iter, &tmp);
        vec->push_back(tmp);
    }
    if (num != vec->size()){
        ret = false;
        return ret;
    }
    return ret;
}